

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O3

long LocaleIndependentAtoi<long>(string_view str)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<long> _Var6;
  long result;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  long local_28;
  
  pcVar5 = str._M_str;
  uVar4 = str._M_len;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_len = uVar4;
  local_38._M_str = pcVar5;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      pvVar1 = memchr(" \f\n\r\t\v",(int)pcVar5[uVar3],6);
      if (pvVar1 == (void *)0x0) {
        if (uVar3 != 0xffffffffffffffff) {
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            (&local_38," \f\n\r\t\v",0xffffffffffffffff,6);
          if (local_38._M_len < uVar3) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",uVar3);
            }
            goto LAB_001392b9;
          }
          uVar4 = (sVar2 - uVar3) + 1;
          if (local_38._M_len - uVar3 < uVar4) {
            uVar4 = local_38._M_len - uVar3;
          }
          pcVar5 = local_38._M_str + uVar3;
          if (uVar4 == 0) {
            uVar4 = 0;
            goto LAB_00139231;
          }
          if (*pcVar5 != '+') goto LAB_00139231;
          if ((uVar4 != 1) && (local_38._M_str[uVar3 + 1] == '-')) goto LAB_00139268;
          uVar4 = uVar4 - 1;
          pcVar5 = local_38._M_str + uVar3 + 1;
          goto LAB_00139231;
        }
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  uVar4 = 0;
  pcVar5 = (char *)0x0;
LAB_00139231:
  _Var6 = std::from_chars<long>(pcVar5,pcVar5 + uVar4,(long *)&local_38,10);
  uVar3 = local_38._M_len;
  if (_Var6.ec != 0) {
    if (_Var6.ec == result_out_of_range) {
      uVar3 = 0x7fffffffffffffff;
      if ((uVar4 != 0) && (*pcVar5 == '-')) {
        uVar3 = 0x8000000000000000;
      }
    }
    else {
LAB_00139268:
      uVar3 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar3;
  }
LAB_001392b9:
  __stack_chk_fail();
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}